

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O0

Argument * __thiscall opencollada::ArgumentParser::findArgument(ArgumentParser *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  Argument *local_8;
  
  local_20[0]._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x180202);
  local_28._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = ::std::operator==(local_20,&local_28);
  if (bVar1) {
    local_8 = (Argument *)Argument::null;
  }
  else {
    ppVar2 = ::std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
                           *)0x180243);
    bVar1 = Argument::isSet(&ppVar2->second);
    if (bVar1) {
      ppVar2 = ::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>
                             *)0x18026b);
      local_8 = &ppVar2->second;
    }
    else {
      local_8 = (Argument *)Argument::null;
    }
  }
  return local_8;
}

Assistant:

const Argument& ArgumentParser::findArgument(const string & name)
	{
		auto it = mArguments.find(name);
		if (it == mArguments.end())
			return Argument::null;
		if (!it->second.isSet())
			return Argument::null;
		return it->second;
	}